

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Port * __thiscall
kratos::Generator::port
          (Generator *this,PortDirection direction,string *port_name,uint32_t width,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size,PortType type,bool is_signed)

{
  element_type *peVar1;
  shared_ptr<kratos::Port> sVar2;
  Generator *local_50;
  undefined1 local_48 [8];
  shared_ptr<kratos::Port> p;
  bool is_signed_local;
  PortType type_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *size_local;
  string *psStack_20;
  uint32_t width_local;
  string *port_name_local;
  Generator *pGStack_10;
  PortDirection direction_local;
  Generator *this_local;
  
  p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = is_signed
  ;
  local_50 = this;
  p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = type;
  size_local._4_4_ = width;
  psStack_20 = port_name;
  port_name_local._4_4_ = direction;
  pGStack_10 = this;
  sVar2 = std::
          make_shared<kratos::Port,kratos::Generator*,kratos::PortDirection&,std::__cxx11::string_const&,unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortType&,bool&>
                    ((Generator **)local_48,(PortDirection *)&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&port_name_local + 4),(uint *)port_name,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&size_local + 4),
                     (PortType *)size,
                     (bool *)((long)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi + 4));
  (*(this->super_IRNode)._vptr_IRNode[7])
            (this,psStack_20,
             sVar2.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  std::
  map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::Port>&>
            ((map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              *)&this->vars_,psStack_20,(shared_ptr<kratos::Port> *)local_48);
  peVar1 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     local_48);
  std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_48);
  return peVar1;
}

Assistant:

Port &Generator::port(PortDirection direction, const std::string &port_name, uint32_t width,
                      const std::vector<uint32_t> &size, PortType type, bool is_signed) {
    auto p = std::make_shared<Port>(this, direction, port_name, width, size, type, is_signed);
    add_port_name(port_name);
    vars_.emplace(port_name, p);
    return *p;
}